

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

void __thiscall
de::FilePath::split(FilePath *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *components)

{
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  value_type local_90;
  value_type local_70;
  char local_4d;
  char c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  int local_1c;
  int pos;
  int curCompStart;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components_local;
  FilePath *this_local;
  
  _pos = components;
  components_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(components);
  local_1c = 0;
  bVar3 = isWinNetPath(this);
  pvVar2 = _pos;
  if (bVar3) {
    std::operator+(&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   separator_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   separator_abi_cxx11_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar3 = isRootPath(this);
    if ((bVar3) && (bVar3 = beginsWithDrive(this), !bVar3)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(_pos,(value_type *)separator_abi_cxx11_);
    }
  }
  for (local_20 = 0; iVar1 = local_20, iVar4 = std::__cxx11::string::length(), pvVar2 = _pos,
      iVar1 < iVar4; local_20 = local_20 + 1) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this);
    local_4d = *pcVar5;
    bVar3 = isSeparator(local_4d);
    pvVar2 = _pos;
    if (bVar3) {
      if (0 < local_20 - local_1c) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar2,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      local_1c = local_20 + 1;
    }
  }
  if (0 < local_20 - local_1c) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar2,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void FilePath::split (std::vector<std::string>& components) const
{
	components.clear();

	int curCompStart = 0;
	int pos;

	if (isWinNetPath())
		components.push_back(separator + separator);
	else if (isRootPath() && !beginsWithDrive())
		components.push_back(separator);

	for (pos = 0; pos < (int)m_path.length(); pos++)
	{
		const char c = m_path[pos];

		if (isSeparator(c))
		{
			if (pos - curCompStart > 0)
				components.push_back(m_path.substr(curCompStart, pos - curCompStart));

			curCompStart = pos+1;
		}
	}

	if (pos - curCompStart > 0)
		components.push_back(m_path.substr(curCompStart, pos - curCompStart));
}